

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O1

void __thiscall
Imf_3_2::CompositeDeepScanLine::setFrameBuffer(CompositeDeepScanLine *this,FrameBuffer *fr)

{
  pointer pbVar1;
  int iVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  ConstIterator CVar5;
  ostream *poVar6;
  ArgExc *this_00;
  char *pcVar7;
  iterator iVar8;
  Data *pDVar9;
  ConstIterator tmp;
  string name;
  int local_1bc;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [23];
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&this->_Data->_channels,3);
  pbVar1 = (this->_Data->_channels).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::_M_replace((ulong)pbVar1,0,(char *)pbVar1->_M_string_length,0x20469f);
  pcVar7 = "ZBack";
  if (this->_Data->_zback == false) {
    pcVar7 = "Z";
  }
  pbVar1 = (this->_Data->_channels).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::_M_replace
            ((ulong)(pbVar1 + 1),0,(char *)pbVar1[1]._M_string_length,(ulong)pcVar7);
  pbVar1 = (this->_Data->_channels).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::_M_replace
            ((ulong)(pbVar1 + 2),0,(char *)pbVar1[2]._M_string_length,0x2046a1);
  std::vector<int,_std::allocator<int>_>::resize(&this->_Data->_bufferMap,0);
  cVar3._M_node = (_Base_ptr)FrameBuffer::begin(fr);
  cVar4._M_node = (_Base_ptr)FrameBuffer::end(fr);
  if (cVar3._M_node != cVar4._M_node) {
    do {
      if ((cVar3._M_node[10]._M_color != _S_black) || (*(int *)&cVar3._M_node[10].field_0x4 != 1)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),"X and/or y subsampling factors of \"",0x23);
        poVar6 = std::operator<<((ostream *)(local_1b8 + 0x10),(char *)(cVar3._M_node + 1));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"\" channel in framebuffer are not 1",0x22);
        this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(this_00,(stringstream *)local_1b8);
        __cxa_throw(this_00,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b8,(char *)(cVar3._M_node + 1),(allocator<char> *)&local_1bc);
      iVar2 = std::__cxx11::string::compare((char *)local_1b8);
      if (iVar2 == 0) {
        pDVar9 = this->_Data;
        local_1bc = 1;
        iVar8._M_current =
             (pDVar9->_bufferMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (pDVar9->_bufferMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&pDVar9->_bufferMap,iVar8,&local_1bc);
        }
        else {
          *iVar8._M_current = 1;
LAB_00158d3e:
          (pDVar9->_bufferMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar8._M_current + 1;
        }
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)local_1b8);
        if (iVar2 == 0) {
          pDVar9 = this->_Data;
          local_1bc = 0;
          iVar8._M_current =
               (pDVar9->_bufferMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar8._M_current !=
              (pDVar9->_bufferMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *iVar8._M_current = 0;
            goto LAB_00158d3e;
          }
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&pDVar9->_bufferMap,iVar8,&local_1bc);
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)local_1b8);
          pDVar9 = this->_Data;
          if (iVar2 == 0) {
            local_1bc = 2;
            iVar8._M_current =
                 (pDVar9->_bufferMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar8._M_current !=
                (pDVar9->_bufferMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *iVar8._M_current = 2;
              goto LAB_00158d3e;
            }
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&pDVar9->_bufferMap,iVar8,&local_1bc);
          }
          else {
            local_1bc = (int)((ulong)((long)(pDVar9->_channels).
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pDVar9->_channels).
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5);
            iVar8._M_current =
                 (pDVar9->_bufferMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar8._M_current ==
                (pDVar9->_bufferMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&pDVar9->_bufferMap,iVar8,&local_1bc);
            }
            else {
              *iVar8._M_current = local_1bc;
              (pDVar9->_bufferMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar8._M_current + 1;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->_Data->_channels,(value_type *)local_1b8);
          }
        }
      }
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
      }
      cVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar3._M_node);
      CVar5 = FrameBuffer::end(fr);
    } while ((const_iterator)cVar3._M_node != CVar5._i._M_node);
  }
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::operator=((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
               *)&this->_Data->_outputFrameBuffer,
              (_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
               *)fr);
  return;
}

Assistant:

void
CompositeDeepScanLine::setFrameBuffer (const FrameBuffer& fr)
{

    //
    // count channels; build map between channels in frame buffer
    // and channels in internal buffers
    //

    _Data->_channels.resize (3);
    _Data->_channels[0] = "Z";
    _Data->_channels[1] = _Data->_zback ? "ZBack" : "Z";
    _Data->_channels[2] = "A";
    _Data->_bufferMap.resize (0);

    for (FrameBuffer::ConstIterator q = fr.begin (); q != fr.end (); q++)
    {

        //
        // Frame buffer must have xSampling and ySampling set to 1
        // (Sampling in FrameBuffers must match sampling in file,
        //  and Header::sanityCheck enforces sampling in deep files is 1)
        //

        if (q.slice ().xSampling != 1 || q.slice ().ySampling != 1)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "X and/or y subsampling factors "
                "of \""
                    << q.name ()
                    << "\" channel in framebuffer "
                       "are not 1");
        }

        string name (q.name ());
        if (name == "ZBack") { _Data->_bufferMap.push_back (1); }
        else if (name == "Z")
        {
            _Data->_bufferMap.push_back (0);
        }
        else if (name == "A")
        {
            _Data->_bufferMap.push_back (2);
        }
        else
        {
            _Data->_bufferMap.push_back (
                static_cast<int> (_Data->_channels.size ()));
            _Data->_channels.push_back (name);
        }
    }

    _Data->_outputFrameBuffer = fr;
}